

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O1

void __thiscall wasm::StringLifting::run(StringLifting *this,Module *module)

{
  byte *pbVar1;
  int iVar2;
  pointer puVar3;
  Global *pGVar4;
  pointer pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar6;
  char *pcVar7;
  pointer puVar8;
  Function *pFVar9;
  undefined1 __nptr [8];
  bool bVar10;
  string_view *psVar11;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  _Var12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  ostream *poVar18;
  iterator iVar19;
  string *defaultValue;
  char *pcVar20;
  Name *pNVar21;
  pointer puVar22;
  CustomSection *pCVar23;
  Module *pMVar24;
  pointer puVar25;
  CustomSection *pCVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  string_view s;
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Type> types_00;
  initializer_list<wasm::Type> types_01;
  initializer_list<wasm::Type> types_02;
  initializer_list<wasm::Type> types_03;
  initializer_list<wasm::Type> types_04;
  initializer_list<wasm::Type> types_05;
  string_view sVar31;
  string_view sVar32;
  Name name;
  Array local_418;
  HeapType local_408;
  undefined1 local_400 [8];
  vector<char,_std::allocator<char>_> copy;
  Type local_278;
  Type local_270;
  Type local_268;
  Type local_260;
  Type local_258;
  Type local_250;
  Type local_248;
  CustomSection *local_240;
  CustomSection *local_238;
  CustomSection *local_230;
  CustomSection *local_228;
  CustomSection *local_220;
  CustomSection *local_218;
  undefined1 local_210 [8];
  StringApplier applier;
  pointer local_88;
  CustomSection *local_80;
  Module *local_78;
  iterator local_70;
  undefined1 auStack_68 [8];
  Name wtf8;
  ulong local_38;
  
  copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_400;
  local_400 = (undefined1  [8])
              &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"string-constants-module","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_68,WasmStringConstsModule,(allocator<char> *)&local_88);
  defaultValue = (string *)auStack_68;
  Pass::getArgumentOrDefault((string *)local_210,&this->super_Pass,(string *)local_400,defaultValue)
  ;
  sVar31._M_str = (char *)0x0;
  sVar31._M_len = (size_t)local_210;
  sVar31 = IString::interned((IString *)
                             applier.
                             super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                             .super_Pass._vptr_Pass,sVar31,SUB81(defaultValue,0));
  if (local_210 !=
      (undefined1  [8])
      &applier.
       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
       super_Pass.runner) {
    operator_delete((void *)local_210,
                    (ulong)((long)&(applier.
                                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                    .super_Pass.runner)->_vptr_PassRunner + 1));
  }
  if (auStack_68 != (undefined1  [8])&wtf8.super_IString.str._M_str) {
    operator_delete((void *)auStack_68,(ulong)(wtf8.super_IString.str._M_str + 1));
  }
  if (local_400 !=
      (undefined1  [8])
      &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((void *)local_400,
                    (ulong)(copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1));
  }
  puVar22 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = module;
  if (puVar22 == puVar3) {
    pcVar20 = (char *)0x0;
  }
  else {
    pcVar20 = (char *)0x0;
    do {
      pGVar4 = (puVar22->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((*(char **)((long)&(pGVar4->super_Importable).module + 8) != (char *)0x0) &&
         (*(char **)((long)&(pGVar4->super_Importable).module + 8) == sVar31._M_str)) {
        pGVar4 = (puVar22->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        auStack_68 = *(undefined1 (*) [8])&(pGVar4->super_Importable).base.super_IString.str;
        wtf8.super_IString.str._M_len = *(size_t *)((long)&(pGVar4->super_Importable).base + 8);
        std::__cxx11::stringstream::stringstream((stringstream *)local_210);
        sVar32._M_str = pcVar20;
        sVar32._M_len = wtf8.super_IString.str._M_len;
        bVar10 = String::convertWTF8ToWTF16
                           ((String *)
                            &applier.
                             super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                             .super_Pass.runner,(ostream *)auStack_68,sVar32);
        if (!bVar10) {
          Fatal::Fatal((Fatal *)local_400);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish,"Bad string to lift: ",0x14);
          Fatal::operator<<((Fatal *)local_400,(Name *)auStack_68);
          Fatal::~Fatal((Fatal *)local_400);
        }
        std::__cxx11::stringbuf::str();
        s._M_str = (char *)0x0;
        s._M_len = (size_t)local_400;
        sVar32 = IString::interned((IString *)
                                   copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start,s,SUB81(pcVar20,0));
        psVar11 = (string_view *)
                  std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->importedStrings,
                               (key_type *)
                               (puVar22->_M_t).
                               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        *psVar11 = sVar32;
        if (local_400 !=
            (undefined1  [8])
            &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish) {
          operator_delete((void *)local_400,
                          (ulong)(copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_210);
        std::ios_base::~ios_base
                  ((ios_base *)
                   ((long)applier.
                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                          .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                          super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.
                          fixed._M_elems + 0x10));
        pcVar20 = (char *)CONCAT71((int7)((ulong)pcVar20 >> 8),1);
      }
      puVar22 = puVar22 + 1;
    } while (puVar22 != puVar3);
  }
  pMVar24 = local_78;
  local_38 = (ulong)pcVar20 & 0xffffffff;
  _Var12 = std::
           __find_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,__gnu_cxx::__ops::_Iter_pred<wasm::StringLifting::run(wasm::Module*)::_lambda(wasm::CustomSection&)_1_>>
                     ((local_78->customSections).
                      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (local_78->customSections).
                      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  if (_Var12._M_current !=
      (pMVar24->customSections).
      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_400,&(_Var12._M_current)->data);
    auStack_68._0_4_ = 3;
    wtf8.super_IString.str._M_len = 0;
    json::Value::parse((Value *)auStack_68,(char *)local_400,WTF16);
    local_70._M_current = _Var12._M_current;
    if (auStack_68._0_4_ != Array) {
      Fatal::Fatal((Fatal *)local_210);
      Fatal::operator<<((Fatal *)local_210,
                        (char (*) [59])"StringLifting: string.const section should be a JSON array")
      ;
LAB_00a5d017:
      Fatal::~Fatal((Fatal *)local_210);
    }
    pCVar23 = (CustomSection *)
              (pMVar24->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar26 = (CustomSection *)
              (pMVar24->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar23 != pCVar26) {
      local_80 = pCVar26;
      do {
        pcVar5 = (pCVar23->name)._M_dataplus._M_p;
        if ((*(long *)(pcVar5 + 0x20) != 0) &&
           (sVar31 = IString::interned((IString *)0xc,(string_view)ZEXT816(0xe21f9c),
                                       SUB81(pcVar20,0)), *(char **)(pcVar5 + 0x20) == sVar31._M_str
           )) {
          pcVar5 = (pCVar23->name)._M_dataplus._M_p;
          lVar15 = *(long *)(pcVar5 + 0x30);
          local_210 = (undefined1  [8])
                      &applier.
                       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                       .super_Pass.runner;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_210,lVar15,*(long *)(pcVar5 + 0x28) + lVar15);
          __nptr = local_210;
          piVar13 = __errno_location();
          iVar2 = *piVar13;
          *piVar13 = 0;
          uVar14 = strtol((char *)__nptr,&local_88,10);
          if ((undefined1  [8])local_88 == __nptr) {
            std::__throw_invalid_argument("stoi");
LAB_00a5cc63:
            __assert_fail("isArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                          ,0x185,"size_t json::Value::size()");
          }
          if (((long)(int)uVar14 != uVar14) || (*piVar13 == 0x22)) {
            std::__throw_out_of_range("stoi");
          }
          if (*piVar13 == 0) {
            *piVar13 = iVar2;
          }
          if (local_210 !=
              (undefined1  [8])
              &applier.
               super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
               .super_Pass.runner) {
            operator_delete((void *)local_210,
                            (ulong)((long)&(applier.
                                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                            .super_Pass.runner)->_vptr_PassRunner + 1));
          }
          if (auStack_68._0_4_ != Array) goto LAB_00a5cc63;
          pcVar20 = *(char **)wtf8.super_IString.str._M_len;
          if ((ulong)(*(long *)(wtf8.super_IString.str._M_len + 8) - (long)pcVar20 >> 4) <=
              (uVar14 & 0xffffffff)) {
            Fatal::Fatal((Fatal *)local_210);
            Fatal::operator<<((Fatal *)local_210,
                              (char (*) [49])"StringLifting: bad index in string.const section");
            goto LAB_00a5d017;
          }
          lVar15 = (uVar14 & 0xffffffff) * 0x10;
          piVar13 = *(int **)(pcVar20 + lVar15);
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar20 + lVar15 + 8);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          if (*piVar13 != 0) {
            Fatal::Fatal((Fatal *)local_210);
            Fatal::operator<<((Fatal *)local_210,
                              (char (*) [58])
                              "StringLifting: string.const section entry is not a string");
            goto LAB_00a5d017;
          }
          sVar16 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::count(&(this->importedStrings)._M_h,
                           (key_type *)(pCVar23->name)._M_dataplus._M_p);
          if (sVar16 != 0) {
            Fatal::Fatal((Fatal *)local_210);
            Fatal::operator<<((Fatal *)local_210,
                              (char (*) [57])
                              "StringLifting: string.const section tramples other const");
            goto LAB_00a5d017;
          }
          if (*piVar13 != 0) {
            __assert_fail("isString()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                          ,0xc2,"IString &json::Value::getIString()");
          }
          sVar6 = *(size_t *)(piVar13 + 2);
          pcVar7 = *(char **)(piVar13 + 4);
          pmVar17 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->importedStrings,
                                 (key_type *)(pCVar23->name)._M_dataplus._M_p);
          pCVar26 = local_80;
          (pmVar17->super_IString).str._M_len = sVar6;
          (pmVar17->super_IString).str._M_str = pcVar7;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        pCVar23 = (CustomSection *)&(pCVar23->name)._M_string_length;
      } while (pCVar23 != pCVar26);
    }
    pMVar24 = local_78;
    iVar19._M_current = local_70._M_current;
    std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::_M_erase
              (&local_78->customSections,local_70);
    json::Value::free((Value *)auStack_68,iVar19._M_current);
    if (local_400 != (undefined1  [8])0x0) {
      operator_delete((void *)local_400,
                      (long)copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)local_400);
    }
  }
  local_418.element.type.id = 2;
  local_418.element.packedType = i16;
  local_418.element.mutable_ = Mutable;
  HeapType::HeapType(&local_408,&local_418);
  if (((uint)(0x7c < local_408.id) * 4 + 3 & (uint)local_408.id) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  puVar25 = (pMVar24->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pMVar24->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar25 != puVar8) {
    local_218 = (CustomSection *)&this->substringImport;
    local_220 = (CustomSection *)&this->charCodeAtImport;
    local_228 = (CustomSection *)&this->lengthImport;
    local_230 = (CustomSection *)&this->compareImport;
    local_238 = (CustomSection *)&this->equalsImport;
    local_240 = (CustomSection *)&this->intoCharCodeArrayImport;
    local_70._M_current = (CustomSection *)&this->concatImport;
    pNVar21 = &this->fromCodePointImport;
    local_80 = (CustomSection *)pNVar21;
    do {
      pFVar9 = (puVar25->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((*(char **)((long)&(pFVar9->super_Importable).module + 8) != (char *)0x0) &&
         (*(char **)((long)&(pFVar9->super_Importable).module + 8) == DAT_010d1ba8)) {
        _local_400 = HeapType::getSignature
                               (&((puVar25->_M_t).
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                                 type);
        pFVar9 = (puVar25->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        sVar31 = IString::interned((IString *)0x11,(string_view)ZEXT816(0xe2204d),SUB81(pNVar21,0));
        if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
          applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass._vptr_Pass = (_func_int **)0x2;
          applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass.runner = (PassRunner *)0x2;
          types._M_len = 3;
          types._M_array = (iterator)local_210;
          local_210 = (undefined1  [8])(local_408.id | 2);
          wasm::Type::Type(&local_278,types);
          if ((local_400 != (undefined1  [8])local_278.id) ||
             (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start != &DAT_00000008)) {
            Fatal::Fatal((Fatal *)local_210);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass.runner,"StringLifting: bad signature for fromCharCodeArray: ",
                       0x34);
            Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
            goto LAB_00a5d017;
          }
          pFVar9 = (puVar25->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
          uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
          uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
          uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
          iVar19._M_current = (CustomSection *)&this->fromCharCodeArrayImport;
        }
        else {
          pFVar9 = (puVar25->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          sVar31 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xe22094),SUB81(pNVar21,0))
          ;
          if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
            if ((local_400 != (undefined1  [8])0x2) ||
               (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start != &DAT_00000008)) {
              Fatal::Fatal((Fatal *)local_210);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &applier.
                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                          .super_Pass.runner,"StringLifting: bad signature for fromCodePoint: ",0x30
                        );
              Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
              goto LAB_00a5d017;
            }
            pFVar9 = (puVar25->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
            uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
            uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
            uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
            iVar19._M_current = local_80;
          }
          else {
            pFVar9 = (puVar25->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            sVar31 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe2046a),
                                       SUB81(pNVar21,0));
            if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
              local_210 = (undefined1  [8])0xa;
              applier.
              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
              .super_Pass._vptr_Pass = (_func_int **)0xa;
              types_00._M_len = 2;
              types_00._M_array = (iterator)local_210;
              wasm::Type::Type(&local_270,types_00);
              if ((local_400 != (undefined1  [8])local_270.id) ||
                 (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != &DAT_00000008)) {
                Fatal::Fatal((Fatal *)local_210);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           &applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_Pass.runner,"StringLifting: bad signature for concta: ",0x29);
                Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                goto LAB_00a5d017;
              }
              pFVar9 = (puVar25->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
              uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
              uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
              uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
              uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
              iVar19._M_current = local_70._M_current;
            }
            else {
              pFVar9 = (puVar25->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
              sVar31 = IString::interned((IString *)0x11,(string_view)ZEXT816(0xe220fd),
                                         SUB81(pNVar21,0));
              if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
                local_210 = (undefined1  [8])0xa;
                applier.
                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                .super_Pass.runner = (PassRunner *)0x2;
                types_01._M_len = 3;
                types_01._M_array = (iterator)local_210;
                applier.
                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                .super_Pass._vptr_Pass = (_func_int **)(local_408.id | 2);
                wasm::Type::Type(&local_268,types_01);
                if ((local_400 != (undefined1  [8])local_268.id) ||
                   (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x2)) {
                  Fatal::Fatal((Fatal *)local_210);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             &applier.
                              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                              .super_Pass.runner,
                             "StringLifting: bad signature for intoCharCodeArray: ",0x34);
                  Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                  goto LAB_00a5d017;
                }
                pFVar9 = (puVar25->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
                uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
                uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
                uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
                iVar19._M_current = local_240;
              }
              else {
                pFVar9 = (puVar25->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                sVar31 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe22144),
                                           SUB81(pNVar21,0));
                if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
                  local_210 = (undefined1  [8])0xa;
                  applier.
                  super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                  .super_Pass._vptr_Pass = (_func_int **)0xa;
                  types_02._M_len = 2;
                  types_02._M_array = (iterator)local_210;
                  wasm::Type::Type(&local_260,types_02);
                  if ((local_400 != (undefined1  [8])local_260.id) ||
                     (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x2)) {
                    Fatal::Fatal((Fatal *)local_210);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               &applier.
                                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                .super_Pass.runner,"StringLifting: bad signature for equals: ",0x29)
                    ;
                    Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                    goto LAB_00a5d017;
                  }
                  pFVar9 = (puVar25->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                  uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
                  uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
                  uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
                  uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
                  iVar19._M_current = local_238;
                }
                else {
                  pFVar9 = (puVar25->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                  sVar31 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe20482),
                                             SUB81(pNVar21,0));
                  if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
                    local_210 = (undefined1  [8])0xa;
                    applier.
                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                    .super_Pass._vptr_Pass = (_func_int **)0xa;
                    types_03._M_len = 2;
                    types_03._M_array = (iterator)local_210;
                    wasm::Type::Type(&local_258,types_03);
                    if ((local_400 != (undefined1  [8])local_258.id) ||
                       (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x2)) {
                      Fatal::Fatal((Fatal *)local_210);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)
                                 &applier.
                                  super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                  .super_Pass.runner,"StringLifting: bad signature for compare: ",
                                 0x2a);
                      Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                      goto LAB_00a5d017;
                    }
                    pFVar9 = (puVar25->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
                    uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
                    uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
                    uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
                    iVar19._M_current = local_230;
                  }
                  else {
                    pFVar9 = (puVar25->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    sVar31 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe74aeb),
                                               SUB81(pNVar21,0));
                    if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
                      if ((local_400 != (undefined1  [8])0xa) ||
                         (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x2)) {
                        Fatal::Fatal((Fatal *)local_210);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &applier.
                                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                    .super_Pass.runner,"StringLifting: bad signature for length: ",
                                   0x29);
                        Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                        goto LAB_00a5d017;
                      }
                      pFVar9 = (puVar25->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
                      uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
                      uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
                      uVar30 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 0xc);
                      iVar19._M_current = local_228;
                    }
                    else {
                      pFVar9 = (puVar25->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      sVar31 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe221ca),
                                                 SUB81(pNVar21,0));
                      if (*(char **)((long)&(pFVar9->super_Importable).base + 8) == sVar31._M_str) {
                        local_210 = (undefined1  [8])0xa;
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass._vptr_Pass = (_func_int **)0x2;
                        types_04._M_len = 2;
                        types_04._M_array = (iterator)local_210;
                        wasm::Type::Type(&local_250,types_04);
                        if ((local_400 != (undefined1  [8])local_250.id) ||
                           (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x2)) {
                          Fatal::Fatal((Fatal *)local_210);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &applier.
                                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                      .super_Pass.runner,
                                     "StringLifting: bad signature for charCodeAt: ",0x2d);
                          Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                          goto LAB_00a5d017;
                        }
                        pFVar9 = (puVar25->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
                        uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
                        uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
                        uVar30 = *(undefined4 *)
                                  ((long)&(pFVar9->super_Importable).super_Named + 0xc);
                        iVar19._M_current = local_220;
                      }
                      else {
                        pFVar9 = (puVar25->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        sVar31 = IString::interned((IString *)&DAT_00000009,
                                                   (string_view)ZEXT816(0xe22203),SUB81(pNVar21,0));
                        if (*(char **)((long)&(pFVar9->super_Importable).base + 8) != sVar31._M_str)
                        {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"warning: unknown strings import: ",0x21)
                          ;
                          pFVar9 = (puVar25->_M_t).
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                          name.super_IString.str._M_str = (char *)pNVar21;
                          name.super_IString.str._M_len =
                               (size_t)*(char **)((long)&(pFVar9->super_Importable).base + 8);
                          poVar18 = wasm::operator<<((wasm *)&std::cerr,
                                                     *(ostream **)
                                                      &(pFVar9->super_Importable).base.super_IString
                                                       .str,name);
                          local_210[0] = 10;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar18,local_210,1);
                          goto LAB_00a5cb20;
                        }
                        local_210 = (undefined1  [8])0xa;
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass._vptr_Pass = (_func_int **)0x2;
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass.runner = (PassRunner *)0x2;
                        types_05._M_len = 3;
                        types_05._M_array = (iterator)local_210;
                        wasm::Type::Type(&local_248,types_05);
                        if ((local_400 != (undefined1  [8])local_248.id) ||
                           (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start != &DAT_00000008)) {
                          Fatal::Fatal((Fatal *)local_210);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &applier.
                                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                      .super_Pass.runner,
                                     "StringLifting: bad signature for substring: ",0x2c);
                          Fatal::operator<<((Fatal *)local_210,(Signature *)local_400);
                          goto LAB_00a5d017;
                        }
                        pFVar9 = (puVar25->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        uVar27 = *(undefined4 *)&(pFVar9->super_Importable).super_Named;
                        uVar28 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 4);
                        uVar29 = *(undefined4 *)((long)&(pFVar9->super_Importable).super_Named + 8);
                        uVar30 = *(undefined4 *)
                                  ((long)&(pFVar9->super_Importable).super_Named + 0xc);
                        iVar19._M_current = local_218;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        *(undefined4 *)&((iVar19._M_current)->name)._M_dataplus._M_p = uVar27;
        *(undefined4 *)((long)&((iVar19._M_current)->name)._M_dataplus._M_p + 4) = uVar28;
        *(undefined4 *)&((iVar19._M_current)->name)._M_string_length = uVar29;
        *(undefined4 *)((long)&((iVar19._M_current)->name)._M_string_length + 4) = uVar30;
        local_38 = 1;
      }
LAB_00a5cb20:
      puVar25 = puVar25 + 1;
    } while (puVar25 != puVar8);
  }
  pMVar24 = local_78;
  if ((local_38 & 1) != 0) {
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.runner =
         (PassRunner *)
         &applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass.name._M_string_length;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass._vptr_Pass = (_func_int **)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.name._M_string_length._0_1_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.replacep = (Expression **)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.fixed._M_elems[9].currp =
         (Expression **)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.currFunction = (Function *)0x0;
    local_210 = (undefined1  [8])&PTR__WalkerPass_01094d30;
    applier.parent._0_1_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.currModule = (Module *)this;
    WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>::run
              ((WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_> *)
               local_210,(this->super_Pass).runner,local_78);
    Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::walkModuleCode
              ((Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_> *)
               ((long)&applier.
                       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                       .super_Pass.passArg.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               + 0x20),pMVar24);
    pbVar1 = (byte *)((long)&(pMVar24->features).features + 1);
    *pbVar1 = *pbVar1 | 0x40;
    if (applier.
        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
        super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
        super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(applier.
                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                      .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                      super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.fixed.
                      _M_elems[9].currp,
                      (long)applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                            super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                            super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.
                            fixed._M_elems[9].currp);
    }
    Pass::~Pass((Pass *)local_210);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // Whether we found any work to do.
    bool found = false;

    // Imported string constants look like
    //
    //   (import "\'" "bar" (global $string.bar.internal.name (ref extern)))
    //
    // That is, they are imported from module "'" and the basename is the
    // actual string. Find them all so we can apply them.
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    for (auto& global : module->globals) {
      if (!global->imported()) {
        continue;
      }
      if (global->module == stringConstsModule) {
        // Encode from WTF-8 to WTF-16.
        auto wtf8 = global->base;
        std::stringstream wtf16;
        bool valid = String::convertWTF8ToWTF16(wtf16, wtf8.str);
        if (!valid) {
          Fatal() << "Bad string to lift: " << wtf8;
        }
        importedStrings[global->name] = wtf16.str();
        found = true;
      }
    }

    // Imported strings may also be found in the string section.
    auto stringSectionIter = std::find_if(
      module->customSections.begin(),
      module->customSections.end(),
      [&](CustomSection& section) { return section.name == "string.consts"; });
    if (stringSectionIter != module->customSections.end()) {
      // We found the string consts section. Parse it.
      auto& section = *stringSectionIter;
      auto copy = section.data;
      json::Value array;
      array.parse(copy.data(), json::Value::WTF16);
      if (!array.isArray()) {
        Fatal() << "StringLifting: string.const section should be a JSON array";
      }

      // We have the array of constants from the section. Find globals that
      // refer to it.
      for (auto& global : module->globals) {
        if (!global->imported() || global->module != "string.const") {
          continue;
        }
        // The index in the array is the basename.
        Index index = std::stoi(std::string(global->base.str));
        if (index >= array.size()) {
          Fatal() << "StringLifting: bad index in string.const section";
        }
        auto item = array[index];
        if (!item->isString()) {
          Fatal()
            << "StringLifting: string.const section entry is not a string";
        }
        if (importedStrings.count(global->name)) {
          Fatal() << "StringLifting: string.const section tramples other const";
        }
        importedStrings[global->name] = item->getIString();
      }

      // Remove the custom section: After lifting it has no purpose (and could
      // cause problems with repeated lifting/lowering).
      module->customSections.erase(stringSectionIter);
    }

    auto array16 = Type(Array(Field(Field::i16, Mutable)), Nullable);
    auto refExtern = Type(HeapType::ext, NonNullable);
    auto externref = Type(HeapType::ext, Nullable);
    auto i32 = Type::i32;

    // Find imported string functions.
    for (auto& func : module->functions) {
      if (!func->imported() || func->module != WasmStringsModule) {
        continue;
      }
      auto sig = func->type.getSignature();
      if (func->base == "fromCharCodeArray") {
        if (sig != Signature({array16, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCharCodeArray: "
                  << sig;
        }
        fromCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "fromCodePoint") {
        if (sig != Signature(i32, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCodePoint: " << sig;
        }
        fromCodePointImport = func->name;
        found = true;
      } else if (func->base == "concat") {
        if (sig != Signature({externref, externref}, refExtern)) {
          Fatal() << "StringLifting: bad signature for concta: " << sig;
        }
        concatImport = func->name;
        found = true;
      } else if (func->base == "intoCharCodeArray") {
        if (sig != Signature({externref, array16, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for intoCharCodeArray: "
                  << sig;
        }
        intoCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "equals") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for equals: " << sig;
        }
        equalsImport = func->name;
        found = true;
      } else if (func->base == "compare") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for compare: " << sig;
        }
        compareImport = func->name;
        found = true;
      } else if (func->base == "length") {
        if (sig != Signature({externref}, i32)) {
          Fatal() << "StringLifting: bad signature for length: " << sig;
        }
        lengthImport = func->name;
        found = true;
      } else if (func->base == "charCodeAt") {
        if (sig != Signature({externref, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for charCodeAt: " << sig;
        }
        charCodeAtImport = func->name;
        found = true;
      } else if (func->base == "substring") {
        if (sig != Signature({externref, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for substring: " << sig;
        }
        substringImport = func->name;
        found = true;
      } else {
        std::cerr << "warning: unknown strings import: " << func->base << '\n';
      }
    }

    if (!found) {
      // Nothing to do.
      return;
    }

    struct StringApplier : public WalkerPass<PostWalker<StringApplier>> {
      bool isFunctionParallel() override { return true; }

      const StringLifting& parent;

      StringApplier(const StringLifting& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }

      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        // Replace global.gets of imported strings with string.const.
        auto iter = parent.importedStrings.find(curr->name);
        if (iter != parent.importedStrings.end()) {
          auto wtf16 = iter->second;
          replaceCurrent(Builder(*getModule()).makeStringConst(wtf16.str));
          modified = true;
        }
      }

      void visitCall(Call* curr) {
        // Replace calls of imported string methods with stringref operations.
        if (curr->target == parent.fromCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringNew(StringNewWTF16Array,
                                          curr->operands[0],
                                          curr->operands[1],
                                          curr->operands[2]));
        } else if (curr->target == parent.fromCodePointImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringNew(StringNewFromCodePoint, curr->operands[0]));
        } else if (curr->target == parent.concatImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringConcat(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.intoCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEncode(StringEncodeWTF16Array,
                                             curr->operands[0],
                                             curr->operands[1],
                                             curr->operands[2]));
        } else if (curr->target == parent.equalsImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqEqual,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.compareImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqCompare,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.lengthImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringMeasure(StringMeasureWTF16, curr->operands[0]));
        } else if (curr->target == parent.charCodeAtImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringWTF16Get(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.substringImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringSliceWTF(curr->operands[0],
                                               curr->operands[1],
                                               curr->operands[2]));
        }
      }

      void visitFunction(Function* curr) {
        // If we made modifications then we need to refinalize, as we replace
        // externrefs with stringrefs, a subtype.
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, getModule());
        }
      }
    };

    StringApplier applier(*this);
    applier.run(getPassRunner(), module);
    applier.walkModuleCode(module);

    // TODO: Add casts. We generate new string.* instructions, and all their
    //       string inputs should be stringref, not externref, but we have not
    //       converted all externrefs to stringrefs (since some externrefs might
    //       be something else). It is not urgent to fix this as the validator
    //       accepts externrefs there atm, and since toolchains will lower
    //       strings out at the end anyhow (which would remove such casts). Note
    //       that if we add a type import for stringref then this problem would
    //       become a lot simpler (we'd convert that type to stringref).

    // Enable the feature so the module validates.
    module->features.enable(FeatureSet::Strings);
  }